

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  allocator<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
  *this;
  initializer_list<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
  __l;
  element_type *peVar1;
  ostream *poVar2;
  shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  *psVar3;
  thread th_meteo;
  global_sub global;
  undefined1 local_178 [32];
  shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  local_158;
  vector<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::allocator<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>
  local_148;
  undefined1 local_130 [8];
  shared_ptr<publisher_t> meteo_station;
  string local_118 [32];
  shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  local_f8;
  undefined1 local_e8 [8];
  shared_ptr<publisher_t> meteo_b_station;
  string local_d0 [32];
  undefined1 local_b0 [8];
  topic_ptr_t<std::__cxx11::basic_string<char>_*> meteo_b;
  string local_98 [32];
  shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  local_78;
  undefined1 local_68 [8];
  shared_ptr<publisher_t> meteo_a_station;
  allocator local_41;
  string local_40 [32];
  undefined1 local_20 [8];
  topic_ptr_t<std::__cxx11::basic_string<char>_*> meteo_a;
  
  meteo_a.
  super___shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._4_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"meteo-a",&local_41);
  ps::create_topic<std::__cxx11::string*>((string *)local_20);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::
  shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  ::shared_ptr(&local_78,
               (shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                *)local_20);
  ps::create_publisher<std::__cxx11::string*,publisher_t>
            ((topic_ptr_t<std::__cxx11::basic_string<char>_*> *)local_68);
  std::
  shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  ::~shared_ptr(&local_78);
  peVar1 = std::__shared_ptr_access<publisher_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<publisher_t,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_98,"A",
             (allocator *)
             ((long)&meteo_b.
                     super___shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  publisher_t::set_name(peVar1,(string *)local_98);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&meteo_b.
                     super___shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_d0,"meteo-b",
             (allocator *)
             ((long)&meteo_b_station.super___shared_ptr<publisher_t,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  ps::create_topic<std::__cxx11::string*>((string *)local_b0);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&meteo_b_station.super___shared_ptr<publisher_t,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::
  shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  ::shared_ptr(&local_f8,
               (shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                *)local_b0);
  ps::create_publisher<std::__cxx11::string*,publisher_t>
            ((topic_ptr_t<std::__cxx11::basic_string<char>_*> *)local_e8);
  std::
  shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  ::~shared_ptr(&local_f8);
  peVar1 = std::__shared_ptr_access<publisher_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<publisher_t,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_118,"B",
             (allocator *)
             ((long)&meteo_station.super___shared_ptr<publisher_t,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  publisher_t::set_name(peVar1,(string *)local_118);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&meteo_station.super___shared_ptr<publisher_t,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::
  shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  ::shared_ptr((shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                *)local_178,
               (shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                *)local_20);
  std::
  shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  ::shared_ptr((shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                *)(local_178 + 0x10),
               (shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                *)local_b0);
  local_158.
  super___shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
  this = (allocator<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
          *)((long)&global.counter + 7);
  local_158.
  super___shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)local_178;
  std::
  allocator<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
  ::allocator(this);
  __l._M_len = (size_type)
               local_158.
               super___shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
  __l._M_array = (iterator)
                 local_158.
                 super___shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
  std::
  vector<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::allocator<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>
  ::vector(&local_148,__l,this);
  ps::create_publisher<std::__cxx11::string*,publisher_t>
            ((vector<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::allocator<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>
              *)local_130);
  std::
  vector<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::allocator<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>
  ::~vector(&local_148);
  std::
  allocator<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
  ::~allocator((allocator<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
                *)((long)&global.counter + 7));
  psVar3 = &local_158;
  do {
    psVar3 = psVar3 + -1;
    std::
    shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
    ::~shared_ptr(psVar3);
  } while (psVar3 != (shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                      *)local_178);
  global_sub::global_sub((global_sub *)&stack0xffffffffffc9c118);
  std::
  shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  ::shared_ptr((shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                *)&th_meteo,
               (shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                *)local_20);
  std::
  shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  ::shared_ptr((shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                *)&stack0xffffffffffc9c0f8,
               (shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                *)local_b0);
  ps::Subscriber<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  ::subscribe((Subscriber<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
               *)&stack0xffffffffffc9c118,
              (initializer_list<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
               *)&stack0xffffffffffc9c108);
  psVar3 = (shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
            *)&stack0xffffffffffc9c108;
  do {
    psVar3 = psVar3 + -1;
    std::
    shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
    ::~shared_ptr(psVar3);
  } while (psVar3 != (shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                      *)&th_meteo);
  global.
  super_Subscriber<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  .id = 0;
  ps::Subscriber<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  ::run((Subscriber<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
         *)&stack0xffffffffffc9c118);
  std::shared_ptr<publisher_t>::shared_ptr
            ((shared_ptr<publisher_t> *)&stack0xffffffffffc9c0d0,
             (shared_ptr<publisher_t> *)local_130);
  std::thread::thread<main::__0,,void>
            ((thread *)&stack0xffffffffffc9c0e0,(type *)&stack0xffffffffffc9c0d0);
  main::$_0::~__0((__0 *)&stack0xffffffffffc9c0d0);
  std::thread::join();
  ps::Subscriber<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  ::stop_wait((Subscriber<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
               *)&stack0xffffffffffc9c118);
  poVar2 = std::operator<<((ostream *)&std::cout,"g_counter: ");
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,global.
                             super_Subscriber<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                             .id);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  meteo_a.
  super___shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._4_4_ = 0;
  std::thread::~thread((thread *)&stack0xffffffffffc9c0e0);
  global_sub::~global_sub((global_sub *)&stack0xffffffffffc9c118);
  std::shared_ptr<publisher_t>::~shared_ptr((shared_ptr<publisher_t> *)local_130);
  std::shared_ptr<publisher_t>::~shared_ptr((shared_ptr<publisher_t> *)local_e8);
  std::
  shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  ::~shared_ptr((shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                 *)local_b0);
  std::shared_ptr<publisher_t>::~shared_ptr((shared_ptr<publisher_t> *)local_68);
  std::
  shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  ::~shared_ptr((shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                 *)local_20);
  return meteo_a.
         super___shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi._4_4_;
}

Assistant:

int main()
{
	auto meteo_a = create_topic<std::string*>("meteo-a");
	auto meteo_a_station = create_publisher<std::string*, publisher_t>(meteo_a);
	meteo_a_station->set_name("A");

	auto meteo_b = create_topic<std::string*>("meteo-b");
	auto meteo_b_station = create_publisher<std::string*, publisher_t>(meteo_b);
	meteo_b_station->set_name("B");

	auto meteo_station = create_publisher<std::string*, publisher_t>(std::vector<topic_ptr_t<std::string*>>{meteo_a, meteo_b});

	global_sub global;
	global.subscribe({meteo_a, meteo_b});

	global.counter = 0;
	global.run();

	std::thread th_meteo([=]{
		std::vector<std::string> cities{"Rome", "Florence", "Venice"};

		for (uint32_t i = 0; i < 1000000; i++)
		{
			const std::string tcelsius_a = std::to_string(24 + (i % 10));
			//const std::string tcelsius_b = std::to_string(34 + (i % 19));
			meteo_station->produce(push_data(cities[i%3] + ", " + tcelsius_a));
			//meteo_b_station->produce(push_data(cities[i%3] + ", " + tcelsius_b));
		}
	});

	th_meteo.join();
	global.stop_wait();

	std::cout << "g_counter: " << global.counter << std::endl;

	return 0;
}